

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserFastaTest_ParseWhole_Test::TestBody
          (BioparserFastaTest_ParseWhole_Test *this)

{
  Parser<biosoup::Sequence> *pPVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"sample.fasta",&local_39);
  BioparserFastaTest::Setup(&this->super_BioparserFastaTest,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pPVar1 = (this->super_BioparserFastaTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&local_38,pPVar1,0xffffffffffffffff,1);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::_M_move_assign(&(this->super_BioparserFastaTest).s,&local_38);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
             *)&local_38);
  BioparserFastaTest::Check(&this->super_BioparserFastaTest,true);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, ParseWhole) {
  Setup("sample.fasta");
  s = p->Parse(-1);
  Check();
}